

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjRelease(jx9_value *pObj)

{
  int iVar1;
  jx9_hashmap *pMap;
  uint uVar2;
  
  uVar2 = pObj->iFlags;
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x40) != 0) {
      pMap = (jx9_hashmap *)(pObj->x).pOther;
      iVar1 = pMap->iRef;
      pMap->iRef = iVar1 + -1;
      if (iVar1 < 2) {
        jx9HashmapRelease(pMap,1);
      }
    }
    uVar2 = SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = 0x20;
  }
  return uVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjRelease(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_NULL) == 0 ){
		if( pObj->iFlags & MEMOBJ_HASHMAP ){
			jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
		}
		/* Release the internal buffer */
		SyBlobRelease(&pObj->sBlob);
		/* Invalidate any prior representation */
		pObj->iFlags = MEMOBJ_NULL;
	}
	return SXRET_OK;
}